

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void lgx_compiler_cleanup(lgx_compiler_t *c)

{
  lgx_rb_node_t *local_20;
  lgx_rb_node_t *node;
  lgx_ht_node_t *n;
  lgx_compiler_t *c_local;
  
  if ((c->bc).buffer != (uint32_t *)0x0) {
    free((c->bc).buffer);
  }
  for (node = (lgx_rb_node_t *)lgx_ht_first(&c->constant); node != (lgx_rb_node_t *)0x0;
      node = (lgx_rb_node_t *)lgx_ht_next((lgx_ht_node_t *)node)) {
    lgx_const_del((lgx_const_t *)(node->key).buffer);
    (node->key).buffer = (char *)0x0;
  }
  lgx_ht_cleanup(&c->constant);
  for (node = (lgx_rb_node_t *)lgx_ht_first(&c->global); node != (lgx_rb_node_t *)0x0;
      node = (lgx_rb_node_t *)lgx_ht_next((lgx_ht_node_t *)node)) {
    (node->key).buffer = (char *)0x0;
  }
  lgx_ht_cleanup(&c->global);
  for (local_20 = lgx_rb_first(&c->exception); local_20 != (lgx_rb_node_t *)0x0;
      local_20 = lgx_rb_next(local_20)) {
    lgx_exception_del((lgx_exception_t *)local_20->value);
  }
  lgx_rb_cleanup(&c->exception);
  memset(c,0,0x68);
  return;
}

Assistant:

void lgx_compiler_cleanup(lgx_compiler_t* c) {
    // 释放字节码缓存
    if(c->bc.buffer) {
        xfree(c->bc.buffer);
    }

    // 释放常量表
    lgx_ht_node_t *n;
    for (n = lgx_ht_first(&c->constant); n; n = lgx_ht_next(n)) {
        lgx_const_del(n->v);
        n->v = NULL;
    }
    lgx_ht_cleanup(&c->constant);

    // 释放全局变量
    for (n = lgx_ht_first(&c->global); n; n = lgx_ht_next(n)) {
        n->v = NULL;
    }
    lgx_ht_cleanup(&c->global);

    // 释放异常信息
    lgx_rb_node_t *node;
    for (node = lgx_rb_first(&c->exception); node; node = lgx_rb_next(node)) {
        lgx_exception_del((lgx_exception_t *)node->value);
    }
    lgx_rb_cleanup(&c->exception);

    // 重新初始化内存，避免野指针
    memset(c, 0, sizeof(lgx_compiler_t));
}